

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

int xmlListPushBack(xmlListPtr l,void *data)

{
  _xmlLink *p_Var1;
  _xmlLink *p_Var2;
  xmlGenericErrorFunc p_Var3;
  _xmlLink *p_Var4;
  xmlGenericErrorFunc *pp_Var5;
  void **ppvVar6;
  int iVar7;
  
  if (l == (xmlListPtr)0x0) {
    iVar7 = 0;
  }
  else {
    p_Var1 = l->sentinel->prev;
    p_Var4 = (_xmlLink *)(*xmlMalloc)(0x18);
    if (p_Var4 == (_xmlLink *)0x0) {
      pp_Var5 = __xmlGenericError();
      p_Var3 = *pp_Var5;
      ppvVar6 = __xmlGenericErrorContext();
      iVar7 = 0;
      (*p_Var3)(*ppvVar6,"Cannot initialize memory for new link");
    }
    else {
      p_Var4->data = data;
      p_Var2 = p_Var1->next;
      p_Var4->next = p_Var2;
      p_Var2->prev = p_Var4;
      p_Var1->next = p_Var4;
      p_Var4->prev = p_Var1;
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

int
xmlListPushBack(xmlListPtr l, void *data)
{
    xmlLinkPtr lkPlace, lkNew;

    if (l == NULL)
        return(0);
    lkPlace = l->sentinel->prev;
    /* Add the new link */
    if (NULL ==(lkNew = (xmlLinkPtr )xmlMalloc(sizeof(xmlLink)))) {
        xmlGenericError(xmlGenericErrorContext,
		        "Cannot initialize memory for new link");
        return (0);
    }
    lkNew->data = data;
    lkNew->next = lkPlace->next;
    (lkPlace->next)->prev = lkNew;
    lkPlace->next = lkNew;
    lkNew->prev = lkPlace;
    return 1;
}